

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall higan::Socket::Accept(Socket *this,InetAddress *address)

{
  socklen_t local_34;
  int result_fd;
  socklen_t sockaddr_len;
  sockaddr_in client_addr;
  InetAddress *address_local;
  Socket *this_local;
  
  if (address == (InetAddress *)0x0) {
    this_local._4_4_ = -1;
  }
  else {
    client_addr.sin_zero = (uchar  [8])address;
    memset(&result_fd,0,0x10);
    local_34 = 0x10;
    this_local._4_4_ = accept4(this->fd_,(sockaddr *)&result_fd,&local_34,0x80000);
    InetAddress::SetSockaddr((InetAddress *)client_addr.sin_zero,(sockaddr_in *)&result_fd);
  }
  return this_local._4_4_;
}

Assistant:

int Socket::Accept(InetAddress* address)
{
	if (address == nullptr)
	{
		return -1;
	}

	struct sockaddr_in client_addr{};
	socklen_t sockaddr_len = static_cast<socklen_t>(sizeof client_addr);

	int result_fd = accept4(fd_, reinterpret_cast<sockaddr*>(&client_addr),
			&sockaddr_len, SOCK_CLOEXEC);

	address->SetSockaddr(&client_addr);

	return result_fd;
}